

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void anon_unknown.dwarf_1da0b8a::addFileSetEntry
               (cmGeneratorTarget *headTarget,string *config,
               cmGeneratorExpressionDAGChecker *dagChecker,cmFileSet *fileSet,
               EvaluatedTargetPropertyEntries *entries)

{
  pointer pEVar1;
  pointer pcVar2;
  cmMakefile *this;
  cmGeneratorExpressionDAGChecker *dagChecker_00;
  EvaluatedTargetPropertyEntries *this_00;
  size_type sVar3;
  bool bVar4;
  pointer puVar5;
  cmSourceFile *this_01;
  string *psVar6;
  cmSourceGroup *pcVar7;
  pointer puVar8;
  string *sourceName;
  pointer this_02;
  pointer puVar9;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  *dirCge;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_00;
  allocator<char> local_1c1;
  cmGeneratorTarget *local_1c0;
  cmFileSet *local_1b8;
  __uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  local_1b0;
  cmake *local_1a8;
  cmListFileBacktrace *local_1a0;
  string w;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_178;
  cmGeneratorExpressionDAGChecker *local_158;
  EvaluatedTargetPropertyEntries *local_150;
  string *local_148;
  pointer local_140;
  string *local_138;
  string path;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  local_110;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dirs;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  dirCges;
  TargetPropertyEntryFileSet local_c8;
  string e;
  string local_50;
  
  cmFileSet::CompileDirectoryEntries(&dirCges,fileSet);
  local_1c0 = headTarget;
  local_1b8 = fileSet;
  local_148 = config;
  cmFileSet::EvaluateDirectoryEntries
            (&dirs,fileSet,&dirCges,headTarget->LocalGenerator,config,headTarget,dagChecker);
  do {
    puVar5 = dirCges.
             super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (puVar5 == dirCges.
                  super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) break;
    dirCges.
    super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = puVar5 + 1;
  } while (((puVar5->_M_t).
            super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
            ._M_t.
            super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
            .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
           HadContextSensitiveCondition != true);
  local_1a8 = cmLocalGenerator::GetCMakeInstance(local_1c0->LocalGenerator);
  cmFileSet::CompileFileEntries(&local_110,local_1b8);
  local_140 = local_110.
              super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  puVar8 = local_110.
           super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar9 = local_110.
           super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_158 = dagChecker;
  local_150 = entries;
  do {
    this_00 = local_150;
    dagChecker_00 = local_158;
    if (puVar8 == puVar9) {
LAB_00504b63:
      std::
      vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
      ::~vector(&local_110);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&dirs);
      std::
      vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
      ::~vector(&dirCges);
      return;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_178,&dirs);
    local_c8.EntryCge._M_t.
    super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
    ._M_t.
    super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
    .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl =
         (__uniq_ptr_data<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>,_true,_true>
          )(puVar8->_M_t).
           super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
           .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl;
    (puVar8->_M_t).
    super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
    ._M_t.
    super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
    .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl =
         (cmCompiledGeneratorExpression *)0x0;
    local_c8.super_TargetPropertyEntry.LinkImplItem =
         &cmGeneratorTarget::TargetPropertyEntry::NoLinkImplItem;
    local_c8.super_TargetPropertyEntry._vptr_TargetPropertyEntry =
         (_func_int **)&PTR__TargetPropertyEntryFileSet_00aa89f0;
    local_c8.BaseDirs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_178.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_c8.BaseDirs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_178.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_c8.BaseDirs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_178.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_178.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_178.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_178.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1b0._M_t.
    super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
    .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl =
         (tuple<cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
          )(_Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
            )0x0;
    local_c8.FileSet = local_1b8;
    local_c8.ContextSensitiveDirs =
         puVar5 != dirCges.
                   super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
    std::
    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
    ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 *)&local_1b0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_178);
    std::__cxx11::string::string<std::allocator<char>>((string *)&w,"",(allocator<char> *)&path);
    EvaluateTargetPropertyEntry
              ((EvaluatedTargetPropertyEntry *)&e,local_1c0,local_148,&w,dagChecker_00,
               &local_c8.super_TargetPropertyEntry);
    std::vector<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>::
    emplace_back<EvaluatedTargetPropertyEntry>(&this_00->Entries,(EvaluatedTargetPropertyEntry *)&e)
    ;
    EvaluatedTargetPropertyEntry::~EvaluatedTargetPropertyEntry((EvaluatedTargetPropertyEntry *)&e);
    std::__cxx11::string::~string((string *)&w);
    pEVar1 = (this_00->Entries).
             super__Vector_base<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    sourceName = pEVar1[-1].Values.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    local_138 = pEVar1[-1].Values.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    local_1a0 = &pEVar1[-1].Backtrace;
    while (sourceName != local_138) {
      this_01 = cmMakefile::GetOrCreateSource(local_1c0->Makefile,sourceName,false,Ambiguous);
      __y._M_str = "HEADERS";
      __y._M_len = 7;
      __x._M_str = (local_1b8->Type)._M_dataplus._M_p;
      __x._M_len = (local_1b8->Type)._M_string_length;
      bVar4 = std::operator==(__x,__y);
      if (bVar4) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&e,"HEADER_FILE_ONLY",(allocator<char> *)&path);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&w,"TRUE",(allocator<char> *)&local_50);
        cmSourceFile::SetProperty(this_01,&e,&w);
        std::__cxx11::string::~string((string *)&w);
        std::__cxx11::string::~string((string *)&e);
      }
      e._M_dataplus._M_p = (pointer)&e.field_2;
      e._M_string_length = 0;
      e.field_2._M_local_buf[0] = '\0';
      w._M_dataplus._M_p = (pointer)&w.field_2;
      w._M_string_length = 0;
      w.field_2._M_local_buf[0] = '\0';
      psVar6 = cmSourceFile::ResolveFullPath(this_01,&e,&w);
      std::__cxx11::string::string((string *)&path,(string *)psVar6);
      if (w._M_string_length != 0) {
        cmake::IssueMessage(local_1a8,AUTHOR_WARNING,&w,local_1a0);
      }
      sVar3 = path._M_string_length;
      if (path._M_string_length == 0) {
        if (e._M_string_length != 0) {
          cmake::IssueMessage(local_1a8,FATAL_ERROR,&e,local_1a0);
        }
      }
      else {
        this_02 = (local_1c0->Makefile->SourceGroups).
                  super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pcVar2 = (local_1c0->Makefile->SourceGroups).
                 super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        do {
          if (this_02 == pcVar2) {
            __y_00._M_str = "HEADERS";
            __y_00._M_len = 7;
            __x_00._M_str = (local_1b8->Type)._M_dataplus._M_p;
            __x_00._M_len = (local_1b8->Type)._M_string_length;
            bVar4 = std::operator==(__x_00,__y_00);
            if (bVar4) {
              this = local_1c0->Makefile;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_50,"Header Files",&local_1c1);
              pcVar7 = cmMakefile::GetOrCreateSourceGroup(this,&local_50);
              cmSourceGroup::AddGroupFile(pcVar7,&path);
              std::__cxx11::string::~string((string *)&local_50);
            }
            break;
          }
          pcVar7 = cmSourceGroup::MatchChildrenFiles(this_02,&path);
          this_02 = this_02 + 1;
        } while (pcVar7 == (cmSourceGroup *)0x0);
      }
      std::__cxx11::string::~string((string *)&path);
      std::__cxx11::string::~string((string *)&w);
      std::__cxx11::string::~string((string *)&e);
      sourceName = sourceName + 1;
      puVar9 = local_140;
      if (sVar3 == 0) {
        TargetPropertyEntryFileSet::~TargetPropertyEntryFileSet(&local_c8);
        goto LAB_00504b63;
      }
    }
    TargetPropertyEntryFileSet::~TargetPropertyEntryFileSet(&local_c8);
    puVar8 = puVar8 + 1;
  } while( true );
}

Assistant:

void addFileSetEntry(cmGeneratorTarget const* headTarget,
                     std::string const& config,
                     cmGeneratorExpressionDAGChecker* dagChecker,
                     cmFileSet const* fileSet,
                     EvaluatedTargetPropertyEntries& entries)
{
  auto dirCges = fileSet->CompileDirectoryEntries();
  auto dirs = fileSet->EvaluateDirectoryEntries(
    dirCges, headTarget->GetLocalGenerator(), config, headTarget, dagChecker);
  bool contextSensitiveDirs = false;
  for (auto const& dirCge : dirCges) {
    if (dirCge->GetHadContextSensitiveCondition()) {
      contextSensitiveDirs = true;
      break;
    }
  }
  cmake* cm = headTarget->GetLocalGenerator()->GetCMakeInstance();
  for (auto& entryCge : fileSet->CompileFileEntries()) {
    TargetPropertyEntryFileSet tpe(dirs, contextSensitiveDirs,
                                   std::move(entryCge), fileSet);
    entries.Entries.emplace_back(
      EvaluateTargetPropertyEntry(headTarget, config, "", dagChecker, tpe));
    EvaluatedTargetPropertyEntry const& entry = entries.Entries.back();
    for (auto const& file : entry.Values) {
      auto* sf = headTarget->Makefile->GetOrCreateSource(file);
      if (fileSet->GetType() == "HEADERS"_s) {
        sf->SetProperty("HEADER_FILE_ONLY", "TRUE");
      }

#ifndef CMAKE_BOOTSTRAP
      std::string e;
      std::string w;
      auto path = sf->ResolveFullPath(&e, &w);
      if (!w.empty()) {
        cm->IssueMessage(MessageType::AUTHOR_WARNING, w, entry.Backtrace);
      }
      if (path.empty()) {
        if (!e.empty()) {
          cm->IssueMessage(MessageType::FATAL_ERROR, e, entry.Backtrace);
        }
        return;
      }
      bool found = false;
      for (auto const& sg : headTarget->Makefile->GetSourceGroups()) {
        if (sg.MatchChildrenFiles(path)) {
          found = true;
          break;
        }
      }
      if (!found) {
        if (fileSet->GetType() == "HEADERS"_s) {
          headTarget->Makefile->GetOrCreateSourceGroup("Header Files")
            ->AddGroupFile(path);
        }
      }
#endif
    }
  }
}